

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx2::OrientedDiscMiMBIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  byte bVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  int iVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  Scene *pSVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  int local_2cc;
  Scene *local_2c8;
  undefined1 local_2c0 [32];
  RTCFilterFunctionNArguments local_298;
  RayQueryContext *local_268;
  Primitive *local_260;
  RayHit *local_258;
  float local_250;
  undefined4 local_24c;
  undefined4 local_248;
  float local_244;
  float local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  float local_1a0 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  uint local_80 [4];
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar66 [64];
  
  local_260 = Disc;
  local_258 = ray;
  local_268 = context;
  pSVar43 = context->scene;
  local_80[0] = Disc->sharedGeomID;
  local_2c8 = pSVar43;
  pGVar9 = (pSVar43->geometries).items[local_80[0]].ptr;
  fVar1 = (pGVar9->time_range).lower;
  fVar18 = pGVar9->fnumTimeSegments *
           (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar1) /
           ((pGVar9->time_range).upper - fVar1));
  auVar19 = vroundss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),9);
  auVar19 = vminss_avx(auVar19,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar19 = vmaxss_avx(ZEXT816(0) << 0x20,auVar19);
  iVar35 = (int)auVar19._0_4_;
  uVar48 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar10 = *(long *)&pGVar9[2].numPrimitives;
  lVar38 = (long)iVar35 * 0x38;
  lVar11 = *(long *)(lVar10 + lVar38);
  lVar40 = *(long *)(lVar10 + 0x10 + lVar38);
  uVar46 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar41 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar39 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar45 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar56._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar45);
  auVar56._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar48);
  uVar42 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar75._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar42);
  auVar75._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar46);
  uVar47 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar47);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar41);
  uVar44 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar44);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar39);
  p_Var12 = pGVar9[2].intersectionFilterN;
  lVar11 = *(long *)(p_Var12 + lVar38);
  lVar40 = *(long *)(p_Var12 + lVar38 + 0x10);
  auVar63._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar45);
  auVar63._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar48);
  auVar67._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar42);
  auVar67._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar46);
  auVar71._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar47);
  auVar71._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar41);
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar44);
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar40 * uVar39);
  lVar40 = (long)(iVar35 + 1) * 0x38;
  lVar11 = *(long *)(lVar10 + lVar40);
  lVar10 = *(long *)(lVar10 + 0x10 + lVar40);
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar45);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar48);
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar42);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar46);
  auVar81._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar47);
  auVar81._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar41);
  auVar82._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar44);
  auVar82._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar39);
  lVar10 = *(long *)(p_Var12 + lVar40);
  lVar11 = *(long *)(p_Var12 + lVar40 + 0x10);
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar45 * lVar11);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar48 * lVar11);
  fVar18 = fVar18 - auVar19._0_4_;
  auVar62 = vunpcklps_avx(auVar56,auVar58);
  auVar58 = vunpckhps_avx(auVar56,auVar58);
  auVar56 = vunpcklps_avx(auVar75,auVar59);
  local_1e0 = vunpckhps_avx(auVar75,auVar59);
  auVar20 = vunpcklps_avx(auVar62,auVar56);
  local_a0 = vunpckhps_avx(auVar62,auVar56);
  auVar50 = vunpcklps_avx(auVar63,auVar71);
  auVar62 = vunpckhps_avx(auVar63,auVar71);
  auVar21 = vunpcklps_avx(auVar67,auVar74);
  auVar56 = vunpckhps_avx(auVar67,auVar74);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar47 * lVar11);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar41 * lVar11);
  auVar22 = vunpcklps_avx(auVar62,auVar56);
  auVar23 = vunpcklps_avx(auVar50,auVar21);
  auVar62 = vunpckhps_avx(auVar50,auVar21);
  auVar56 = vunpcklps_avx(auVar76,auVar81);
  local_200 = vunpckhps_avx(auVar76,auVar81);
  auVar50 = vunpcklps_avx(auVar79,auVar82);
  local_1c0 = vunpckhps_avx(auVar79,auVar82);
  auVar54 = vunpcklps_avx(auVar56,auVar50);
  auVar50 = vunpckhps_avx(auVar56,auVar50);
  auVar24 = vunpcklps_avx(auVar49,auVar68);
  auVar56 = vunpckhps_avx(auVar49,auVar68);
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar42 * lVar11);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar46 * lVar11);
  auVar69._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar44);
  auVar69._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar39 * lVar11);
  auVar49 = vunpcklps_avx(auVar72,auVar69);
  auVar21 = vunpckhps_avx(auVar72,auVar69);
  auVar21 = vunpcklps_avx(auVar56,auVar21);
  auVar53 = vunpcklps_avx(auVar24,auVar49);
  auVar56 = vunpckhps_avx(auVar24,auVar49);
  fVar1 = 1.0 - fVar18;
  auVar73._4_4_ = fVar1;
  auVar73._0_4_ = fVar1;
  auVar73._8_4_ = fVar1;
  auVar73._12_4_ = fVar1;
  auVar73._16_4_ = fVar1;
  auVar73._20_4_ = fVar1;
  auVar73._24_4_ = fVar1;
  auVar73._28_4_ = fVar1;
  auVar70._0_4_ = fVar18 * auVar54._0_4_;
  auVar70._4_4_ = fVar18 * auVar54._4_4_;
  auVar70._8_4_ = fVar18 * auVar54._8_4_;
  auVar70._12_4_ = fVar18 * auVar54._12_4_;
  auVar70._16_4_ = fVar18 * auVar54._16_4_;
  auVar70._20_4_ = fVar18 * auVar54._20_4_;
  auVar70._24_4_ = fVar18 * auVar54._24_4_;
  auVar70._28_4_ = 0;
  auVar19 = vfmadd231ps_fma(auVar70,auVar73,auVar20);
  auVar24._4_4_ = fVar18 * auVar53._4_4_;
  auVar24._0_4_ = fVar18 * auVar53._0_4_;
  auVar24._8_4_ = fVar18 * auVar53._8_4_;
  auVar24._12_4_ = fVar18 * auVar53._12_4_;
  auVar24._16_4_ = fVar18 * auVar53._16_4_;
  auVar24._20_4_ = fVar18 * auVar53._20_4_;
  auVar24._24_4_ = fVar18 * auVar53._24_4_;
  auVar24._28_4_ = auVar20._28_4_;
  auVar57._0_4_ = fVar18 * auVar56._0_4_;
  auVar57._4_4_ = fVar18 * auVar56._4_4_;
  auVar57._8_4_ = fVar18 * auVar56._8_4_;
  auVar57._12_4_ = fVar18 * auVar56._12_4_;
  auVar57._16_4_ = fVar18 * auVar56._16_4_;
  auVar57._20_4_ = fVar18 * auVar56._20_4_;
  auVar57._24_4_ = fVar18 * auVar56._24_4_;
  auVar57._28_4_ = 0;
  auVar20._4_4_ = fVar18 * auVar21._4_4_;
  auVar20._0_4_ = fVar18 * auVar21._0_4_;
  auVar20._8_4_ = fVar18 * auVar21._8_4_;
  auVar20._12_4_ = fVar18 * auVar21._12_4_;
  auVar20._16_4_ = fVar18 * auVar21._16_4_;
  auVar20._20_4_ = fVar18 * auVar21._20_4_;
  auVar20._24_4_ = fVar18 * auVar21._24_4_;
  auVar20._28_4_ = auVar56._28_4_;
  auVar25 = vfmadd231ps_fma(auVar24,auVar73,auVar23);
  auVar26 = vfmadd231ps_fma(auVar57,auVar73,auVar62);
  auVar27 = vfmadd231ps_fma(auVar20,auVar73,auVar22);
  bVar8 = Disc->numPrimitives;
  local_80[1] = local_80[0];
  local_80[2] = local_80[0];
  local_80[3] = local_80[0];
  uStack_70 = local_80[0];
  uStack_6c = local_80[0];
  uStack_68 = local_80[0];
  uStack_64 = local_80[0];
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar83._4_4_ = fVar1;
  auVar83._0_4_ = fVar1;
  auVar83._8_4_ = fVar1;
  auVar83._12_4_ = fVar1;
  auVar83._16_4_ = fVar1;
  auVar83._20_4_ = fVar1;
  auVar83._24_4_ = fVar1;
  auVar83._28_4_ = fVar1;
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_e0._4_4_ = fVar2;
  local_e0._0_4_ = fVar2;
  local_e0._8_4_ = fVar2;
  local_e0._12_4_ = fVar2;
  local_e0._16_4_ = fVar2;
  local_e0._20_4_ = fVar2;
  local_e0._24_4_ = fVar2;
  local_e0._28_4_ = fVar2;
  local_c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_bc = local_c0;
  fStack_b8 = local_c0;
  fStack_b4 = local_c0;
  fStack_b0 = local_c0;
  fStack_ac = local_c0;
  fStack_a8 = local_c0;
  fStack_a4 = local_c0;
  auVar62._4_4_ = local_c0 * auVar27._4_4_;
  auVar62._0_4_ = local_c0 * auVar27._0_4_;
  auVar62._8_4_ = local_c0 * auVar27._8_4_;
  auVar62._12_4_ = local_c0 * auVar27._12_4_;
  auVar62._16_4_ = local_c0 * 0.0;
  auVar62._20_4_ = local_c0 * 0.0;
  auVar62._24_4_ = local_c0 * 0.0;
  auVar62._28_4_ = local_c0;
  auVar28 = vfmadd231ps_fma(auVar62,local_e0,ZEXT1632(auVar26));
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar83,ZEXT1632(auVar25));
  auVar53._8_4_ = 0x3f800000;
  auVar53._0_8_ = &DAT_3f8000003f800000;
  auVar53._12_4_ = 0x3f800000;
  auVar53._16_4_ = 0x3f800000;
  auVar53._20_4_ = 0x3f800000;
  auVar53._24_4_ = 0x3f800000;
  auVar53._28_4_ = 0x3f800000;
  auVar56 = vcmpps_avx(ZEXT1632(auVar28),ZEXT832(0) << 0x20,4);
  auVar62 = vblendvps_avx(auVar53,ZEXT1632(auVar28),auVar56);
  auVar21._4_4_ = fVar18 * auVar50._4_4_;
  auVar21._0_4_ = fVar18 * auVar50._0_4_;
  auVar21._8_4_ = fVar18 * auVar50._8_4_;
  auVar21._12_4_ = fVar18 * auVar50._12_4_;
  auVar21._16_4_ = fVar18 * auVar50._16_4_;
  auVar21._20_4_ = fVar18 * auVar50._20_4_;
  auVar21._24_4_ = fVar18 * auVar50._24_4_;
  auVar21._28_4_ = auVar50._28_4_;
  auVar28 = vfmadd231ps_fma(auVar21,auVar73,local_a0);
  auVar50 = vunpcklps_avx(local_200,local_1c0);
  auVar22._4_4_ = fVar18 * auVar50._4_4_;
  auVar22._0_4_ = fVar18 * auVar50._0_4_;
  auVar22._8_4_ = fVar18 * auVar50._8_4_;
  auVar22._12_4_ = fVar18 * auVar50._12_4_;
  auVar22._16_4_ = fVar18 * auVar50._16_4_;
  auVar22._20_4_ = fVar18 * auVar50._20_4_;
  auVar22._24_4_ = fVar18 * auVar50._24_4_;
  auVar22._28_4_ = local_1c0._28_4_;
  auVar50 = vunpcklps_avx(auVar58,local_1e0);
  auVar29 = vfmadd231ps_fma(auVar22,auVar73,auVar50);
  fVar3 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar50._4_4_ = fVar3;
  auVar50._0_4_ = fVar3;
  auVar50._8_4_ = fVar3;
  auVar50._12_4_ = fVar3;
  auVar50._16_4_ = fVar3;
  auVar50._20_4_ = fVar3;
  auVar50._24_4_ = fVar3;
  auVar50._28_4_ = fVar3;
  auVar50 = vsubps_avx(ZEXT1632(auVar29),auVar50);
  auVar23._4_4_ = auVar27._4_4_ * auVar50._4_4_;
  auVar23._0_4_ = auVar27._0_4_ * auVar50._0_4_;
  auVar23._8_4_ = auVar27._8_4_ * auVar50._8_4_;
  auVar23._12_4_ = auVar27._12_4_ * auVar50._12_4_;
  auVar23._16_4_ = auVar50._16_4_ * 0.0;
  auVar23._20_4_ = auVar50._20_4_ * 0.0;
  auVar23._24_4_ = auVar50._24_4_ * 0.0;
  auVar23._28_4_ = auVar54._28_4_;
  fVar4 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar54._4_4_ = fVar4;
  auVar54._0_4_ = fVar4;
  auVar54._8_4_ = fVar4;
  auVar54._12_4_ = fVar4;
  auVar54._16_4_ = fVar4;
  auVar54._20_4_ = fVar4;
  auVar54._24_4_ = fVar4;
  auVar54._28_4_ = fVar4;
  auVar50 = vsubps_avx(ZEXT1632(auVar28),auVar54);
  auVar30 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar26),auVar50);
  fVar5 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar60._4_4_ = fVar5;
  auVar60._0_4_ = fVar5;
  auVar60._8_4_ = fVar5;
  auVar60._12_4_ = fVar5;
  auVar60._16_4_ = fVar5;
  auVar60._20_4_ = fVar5;
  auVar60._24_4_ = fVar5;
  auVar60._28_4_ = fVar5;
  auVar50 = vsubps_avx(ZEXT1632(auVar19),auVar60);
  auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),ZEXT1632(auVar25),auVar50);
  local_2c0 = vdivps_avx(ZEXT1632(auVar30),auVar62);
  uVar6 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar64._4_4_ = uVar6;
  auVar64._0_4_ = uVar6;
  auVar64._8_4_ = uVar6;
  auVar64._12_4_ = uVar6;
  auVar64._16_4_ = uVar6;
  auVar64._20_4_ = uVar6;
  auVar64._24_4_ = uVar6;
  auVar64._28_4_ = uVar6;
  auVar62 = vcmpps_avx(auVar64,local_2c0,2);
  fVar7 = (ray->super_RayK<1>).tfar;
  auVar77._4_4_ = fVar7;
  auVar77._0_4_ = fVar7;
  auVar77._8_4_ = fVar7;
  auVar77._12_4_ = fVar7;
  auVar77._16_4_ = fVar7;
  auVar77._20_4_ = fVar7;
  auVar77._24_4_ = fVar7;
  auVar77._28_4_ = fVar7;
  auVar50 = vcmpps_avx(local_2c0,auVar77,2);
  auVar62 = vandps_avx(auVar50,auVar62);
  auVar78._1_3_ = 0;
  auVar78[0] = bVar8;
  auVar78[4] = bVar8;
  auVar78._5_3_ = 0;
  auVar78[8] = bVar8;
  auVar78._9_3_ = 0;
  auVar78[0xc] = bVar8;
  auVar78._13_3_ = 0;
  auVar78[0x10] = bVar8;
  auVar78._17_3_ = 0;
  auVar78[0x14] = bVar8;
  auVar78._21_3_ = 0;
  auVar78[0x18] = bVar8;
  auVar78._25_3_ = 0;
  auVar78[0x1c] = bVar8;
  auVar78._29_3_ = 0;
  auVar50 = vpcmpgtd_avx2(auVar78,_DAT_0205a920);
  auVar62 = vandps_avx(auVar50,auVar62);
  auVar50 = auVar56 & auVar62;
  if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar50 >> 0x7f,0) != '\0') ||
        (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar50 >> 0xbf,0) != '\0') ||
      (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar50[0x1f] < '\0') {
    auVar50 = vunpckhps_avx(auVar58,local_1e0);
    auVar58 = vunpckhps_avx(local_200,local_1c0);
    auVar32._4_4_ = fVar18 * auVar58._4_4_;
    auVar32._0_4_ = fVar18 * auVar58._0_4_;
    auVar32._8_4_ = fVar18 * auVar58._8_4_;
    auVar32._12_4_ = fVar18 * auVar58._12_4_;
    auVar32._16_4_ = fVar18 * auVar58._16_4_;
    auVar32._20_4_ = fVar18 * auVar58._20_4_;
    auVar32._24_4_ = fVar18 * auVar58._24_4_;
    auVar32._28_4_ = fVar18;
    auVar80 = ZEXT3264(local_2c0);
    auVar31 = vfmadd231ps_fma(auVar32,auVar73,auVar50);
    auVar62 = vandps_avx(auVar56,auVar62);
    auVar30 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
    fVar7 = local_2c0._0_4_;
    fVar18 = local_2c0._4_4_;
    fVar13 = local_2c0._8_4_;
    fVar14 = local_2c0._12_4_;
    fVar15 = local_2c0._16_4_;
    fVar16 = local_2c0._20_4_;
    fVar17 = local_2c0._24_4_;
    auVar61._0_4_ = fVar1 * fVar7 + fVar5;
    auVar61._4_4_ = fVar1 * fVar18 + fVar5;
    auVar61._8_4_ = fVar1 * fVar13 + fVar5;
    auVar61._12_4_ = fVar1 * fVar14 + fVar5;
    auVar61._16_4_ = fVar1 * fVar15 + fVar5;
    auVar61._20_4_ = fVar1 * fVar16 + fVar5;
    auVar61._24_4_ = fVar1 * fVar17 + fVar5;
    auVar61._28_4_ = fVar5 + 0.0;
    auVar55._0_4_ = fVar7 * fVar2 + fVar4;
    auVar55._4_4_ = fVar18 * fVar2 + fVar4;
    auVar55._8_4_ = fVar13 * fVar2 + fVar4;
    auVar55._12_4_ = fVar14 * fVar2 + fVar4;
    auVar55._16_4_ = fVar15 * fVar2 + fVar4;
    auVar55._20_4_ = fVar16 * fVar2 + fVar4;
    auVar55._24_4_ = fVar17 * fVar2 + fVar4;
    auVar55._28_4_ = fVar4 + 0.0;
    auVar51._0_4_ = fVar7 * local_c0 + fVar3;
    auVar51._4_4_ = fVar18 * local_c0 + fVar3;
    auVar51._8_4_ = fVar13 * local_c0 + fVar3;
    auVar51._12_4_ = fVar14 * local_c0 + fVar3;
    auVar51._16_4_ = fVar15 * local_c0 + fVar3;
    auVar51._20_4_ = fVar16 * local_c0 + fVar3;
    auVar51._24_4_ = fVar17 * local_c0 + fVar3;
    auVar51._28_4_ = fVar3 + 0.0;
    auVar62 = vsubps_avx(auVar61,ZEXT1632(auVar19));
    auVar56 = vsubps_avx(auVar55,ZEXT1632(auVar28));
    auVar50 = vsubps_avx(auVar51,ZEXT1632(auVar29));
    auVar33._4_4_ = auVar50._4_4_ * auVar50._4_4_;
    auVar33._0_4_ = auVar50._0_4_ * auVar50._0_4_;
    auVar33._8_4_ = auVar50._8_4_ * auVar50._8_4_;
    auVar33._12_4_ = auVar50._12_4_ * auVar50._12_4_;
    auVar33._16_4_ = auVar50._16_4_ * auVar50._16_4_;
    auVar33._20_4_ = auVar50._20_4_ * auVar50._20_4_;
    auVar33._24_4_ = auVar50._24_4_ * auVar50._24_4_;
    auVar33._28_4_ = auVar50._28_4_;
    auVar19 = vfmadd231ps_fma(auVar33,auVar56,auVar56);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar62,auVar62);
    auVar34._28_4_ = auVar56._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(auVar31._12_4_ * auVar31._12_4_,
                            CONCAT48(auVar31._8_4_ * auVar31._8_4_,
                                     CONCAT44(auVar31._4_4_ * auVar31._4_4_,
                                              auVar31._0_4_ * auVar31._0_4_))));
    auVar62 = vcmpps_avx(ZEXT1632(auVar19),auVar34,1);
    auVar19 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
    auVar19 = vpand_avx(auVar19,auVar30);
    auVar62 = vpmovzxwd_avx2(auVar19);
    auVar62 = vpslld_avx2(auVar62,0x1f);
    if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar62 >> 0x7f,0) != '\0') ||
          (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar62 >> 0xbf,0) != '\0') ||
        (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar62[0x1f] < '\0')
    {
      local_220 = vpsrad_avx2(auVar62,0x1f);
      local_1a0[8] = 0.0;
      local_1a0[9] = 0.0;
      local_1a0[10] = 0.0;
      local_1a0[0xb] = 0.0;
      local_1a0[0xc] = 0.0;
      local_1a0[0xd] = 0.0;
      local_1a0[0xe] = 0.0;
      local_1a0[0xf] = 0.0;
      local_1a0[0] = 0.0;
      local_1a0[1] = 0.0;
      local_1a0[2] = 0.0;
      local_1a0[3] = 0.0;
      local_1a0[4] = 0.0;
      local_1a0[5] = 0.0;
      local_1a0[6] = 0.0;
      local_1a0[7] = 0.0;
      local_160 = local_2c0;
      local_140 = ZEXT1632(auVar25);
      local_120 = ZEXT1632(auVar26);
      local_100 = ZEXT1632(auVar27);
      auVar65._8_4_ = 0x7f800000;
      auVar65._0_8_ = 0x7f8000007f800000;
      auVar65._12_4_ = 0x7f800000;
      auVar65._16_4_ = 0x7f800000;
      auVar65._20_4_ = 0x7f800000;
      auVar65._24_4_ = 0x7f800000;
      auVar65._28_4_ = 0x7f800000;
      auVar66 = ZEXT3264(auVar65);
      auVar62 = vblendvps_avx(auVar65,local_2c0,auVar62);
      auVar56 = vshufps_avx(auVar62,auVar62,0xb1);
      auVar56 = vminps_avx(auVar62,auVar56);
      auVar50 = vshufpd_avx(auVar56,auVar56,5);
      auVar56 = vminps_avx(auVar56,auVar50);
      auVar50 = vpermpd_avx2(auVar56,0x4e);
      auVar56 = vminps_avx(auVar56,auVar50);
      auVar62 = vcmpps_avx(auVar62,auVar56,0);
      auVar25 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
      auVar19 = vpand_avx(auVar25,auVar19);
      auVar62 = vpmovzxwd_avx2(auVar19);
      auVar62 = vpslld_avx2(auVar62,0x1f);
      if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar62 >> 0x7f,0) == '\0') &&
            (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar62 >> 0xbf,0) == '\0') &&
          (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar62[0x1f])
      {
        auVar62 = local_220;
      }
      uVar36 = vmovmskps_avx(auVar62);
      uVar37 = 0;
      for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
        uVar37 = uVar37 + 1;
      }
      do {
        uVar39 = (ulong)uVar37;
        local_238 = local_80[uVar39];
        pGVar9 = (pSVar43->geometries).items[local_238].ptr;
        if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
          *(undefined4 *)(local_220 + uVar39 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar1 = local_1a0[uVar39];
            fVar2 = local_1a0[uVar39 + 8];
            (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar39 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)(local_140 + uVar39 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)(local_120 + uVar39 * 4);
            (ray->Ng).field_0.field_0.z = *(float *)(local_100 + uVar39 * 4);
            ray->u = fVar1;
            ray->v = fVar2;
            ray->primID = (Disc->primIDs).field_0.i[uVar39];
            ray->geomID = local_238;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_250 = *(float *)(local_140 + uVar39 * 4);
          local_24c = *(undefined4 *)(local_120 + uVar39 * 4);
          local_248 = *(undefined4 *)(local_100 + uVar39 * 4);
          local_244 = local_1a0[uVar39];
          local_240 = local_1a0[uVar39 + 8];
          local_23c = (Disc->primIDs).field_0.i[uVar39];
          local_234 = context->user->instID[0];
          local_230 = context->user->instPrimID[0];
          local_1e0._0_4_ = (ray->super_RayK<1>).tfar;
          (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar39 * 4);
          local_2cc = -1;
          local_298.valid = &local_2cc;
          local_298.geometryUserPtr = pGVar9->userPtr;
          local_298.context = context->user;
          local_298.ray = (RTCRayN *)ray;
          local_298.hit = (RTCHitN *)&local_250;
          local_298.N = 1;
          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01901765:
            p_Var12 = context->args->filter;
            if (p_Var12 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var12)(&local_298);
                auVar66 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar80 = ZEXT3264(local_2c0);
                pSVar43 = local_2c8;
              }
              if (*local_298.valid == 0) goto LAB_0190186c;
            }
            (((Vec3f *)((long)local_298.ray + 0x30))->field_0).field_0.x = *(float *)local_298.hit;
            (((Vec3f *)((long)local_298.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_298.hit + 4);
            (((Vec3f *)((long)local_298.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_298.hit + 8);
            *(float *)((long)local_298.ray + 0x3c) = *(float *)(local_298.hit + 0xc);
            *(float *)((long)local_298.ray + 0x40) = *(float *)(local_298.hit + 0x10);
            *(float *)((long)local_298.ray + 0x44) = *(float *)(local_298.hit + 0x14);
            *(float *)((long)local_298.ray + 0x48) = *(float *)(local_298.hit + 0x18);
            *(float *)((long)local_298.ray + 0x4c) = *(float *)(local_298.hit + 0x1c);
            *(float *)((long)local_298.ray + 0x50) = *(float *)(local_298.hit + 0x20);
          }
          else {
            (*pGVar9->intersectionFilterN)(&local_298);
            auVar66 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar80 = ZEXT3264(local_2c0);
            pSVar43 = local_2c8;
            if (*local_298.valid != 0) goto LAB_01901765;
LAB_0190186c:
            (ray->super_RayK<1>).tfar = (float)local_1e0._0_4_;
          }
          *(undefined4 *)(local_220 + uVar39 * 4) = 0;
          fVar1 = (ray->super_RayK<1>).tfar;
          auVar52._4_4_ = fVar1;
          auVar52._0_4_ = fVar1;
          auVar52._8_4_ = fVar1;
          auVar52._12_4_ = fVar1;
          auVar52._16_4_ = fVar1;
          auVar52._20_4_ = fVar1;
          auVar52._24_4_ = fVar1;
          auVar52._28_4_ = fVar1;
          auVar62 = vcmpps_avx(auVar80._0_32_,auVar52,2);
          local_220 = vandps_avx(auVar62,local_220);
        }
        if ((((((((local_220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_220 >> 0x7f,0) == '\0') &&
              (local_220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_220 >> 0xbf,0) == '\0') &&
            (local_220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_220[0x1f]) {
          return;
        }
        auVar62 = vblendvps_avx(auVar66._0_32_,auVar80._0_32_,local_220);
        auVar56 = vshufps_avx(auVar62,auVar62,0xb1);
        auVar56 = vminps_avx(auVar62,auVar56);
        auVar50 = vshufpd_avx(auVar56,auVar56,5);
        auVar56 = vminps_avx(auVar56,auVar50);
        auVar50 = vpermpd_avx2(auVar56,0x4e);
        auVar56 = vminps_avx(auVar56,auVar50);
        auVar56 = vcmpps_avx(auVar62,auVar56,0);
        auVar50 = local_220 & auVar56;
        auVar62 = local_220;
        if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar50 >> 0x7f,0) != '\0') ||
              (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar50 >> 0xbf,0) != '\0') ||
            (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar50[0x1f] < '\0') {
          auVar62 = vandps_avx(auVar56,local_220);
        }
        uVar36 = vmovmskps_avx(auVar62);
        uVar37 = 0;
        for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
          uVar37 = uVar37 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }